

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.cpp
# Opt level: O2

void crnlib::crnlib_print_mem_stats(void)

{
  return;
}

Assistant:

void crnlib_print_mem_stats() {
#if CRNLIB_MEM_STATS
  if (console::is_initialized()) {
    console::debug("crnlib_print_mem_stats:");
    console::debug("Current blocks: %u, allocated: " CRNLIB_INT64_FORMAT_SPECIFIER ", max ever allocated: " CRNLIB_INT64_FORMAT_SPECIFIER, g_total_blocks, (int64)g_total_allocated, (int64)g_max_allocated);
  } else {
    printf("crnlib_print_mem_stats:\n");
    printf("Current blocks: %u, allocated: " CRNLIB_INT64_FORMAT_SPECIFIER ", max ever allocated: " CRNLIB_INT64_FORMAT_SPECIFIER "\n", g_total_blocks, (int64)g_total_allocated, (int64)g_max_allocated);
  }
#endif
}